

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

int luaD_pretailcall(lua_State *L,CallInfo *ci,StkId func,int narg1,int delta)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  StkId pSVar4;
  long lVar5;
  byte bVar6;
  uint status;
  int iVar7;
  lua_CFunction f;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  undefined1 *puVar12;
  
  uVar9 = (ulong)narg1;
  uVar11 = uVar9 << 4 | 8;
  status = 0;
  while( true ) {
    bVar6 = (func->val).tt_ & 0x3f;
    if (bVar6 == 6) {
      lVar3 = *(long *)((func->val).value_.f + 0x18);
      bVar6 = *(byte *)(lVar3 + 0xc);
      bVar2 = *(byte *)(lVar3 + 10);
      lVar10 = (ulong)bVar6 - (long)delta;
      if ((long)(L->stack_last).p - (L->top).offset >> 4 <= lVar10) {
        lVar5 = (L->stack).offset;
        luaD_growstack(L,(int)lVar10,1);
        func = (StkId)(((long)func - lVar5) + (long)(L->stack).p);
      }
      (ci->func).p = (ci->func).p + -(long)delta;
      lVar10 = 0;
      uVar8 = 0;
      if (0 < (int)uVar9) {
        uVar8 = uVar9 & 0xffffffff;
      }
      for (; pSVar4 = (ci->func).p, uVar8 * 0x10 != lVar10; lVar10 = lVar10 + 0x10) {
        *(undefined8 *)((long)pSVar4 + lVar10) = *(undefined8 *)((long)func + lVar10);
        *(undefined1 *)((long)pSVar4 + lVar10 + 8) = *(undefined1 *)((long)func + lVar10 + 8);
      }
      puVar12 = (undefined1 *)(uVar11 + (long)pSVar4);
      for (; (long)uVar9 <= (long)(ulong)bVar2; uVar9 = uVar9 + 1) {
        *puVar12 = 0;
        puVar12 = puVar12 + 0x10;
      }
      (ci->top).p = pSVar4 + (ulong)bVar6 + 1;
      (ci->u).l.savedpc = *(Instruction **)(lVar3 + 0x40);
      pbVar1 = (byte *)((long)&ci->callstatus + 2);
      *pbVar1 = *pbVar1 | 0x40;
      (L->top).p = pSVar4 + (uVar9 & 0xffffffff);
      return -1;
    }
    if (bVar6 == 0x16) break;
    if (bVar6 == 0x26) {
      f = *(lua_CFunction *)((func->val).value_.f + 0x18);
      goto LAB_0010af1f;
    }
    if ((long)(L->stack_last).p - (L->top).offset < 0x11) {
      lVar3 = (L->stack).offset;
      luaD_growstack(L,1,1);
      func = (StkId)(((long)func - lVar3) + (long)(L->stack).p);
    }
    status = tryfuncTM(L,func,status);
    uVar9 = uVar9 + 1;
    uVar11 = uVar11 + 0x10;
  }
  f = (func->val).value_.f;
LAB_0010af1f:
  iVar7 = precallC(L,func,status,f);
  return iVar7;
}

Assistant:

int luaD_pretailcall (lua_State *L, CallInfo *ci, StkId func,
                                    int narg1, int delta) {
  unsigned status = LUA_MULTRET + 1;
 retry:
  switch (ttypetag(s2v(func))) {
    case LUA_VCCL:  /* C closure */
      return precallC(L, func, status, clCvalue(s2v(func))->f);
    case LUA_VLCF:  /* light C function */
      return precallC(L, func, status, fvalue(s2v(func)));
    case LUA_VLCL: {  /* Lua function */
      Proto *p = clLvalue(s2v(func))->p;
      int fsize = p->maxstacksize;  /* frame size */
      int nfixparams = p->numparams;
      int i;
      checkstackp(L, fsize - delta, func);
      ci->func.p -= delta;  /* restore 'func' (if vararg) */
      for (i = 0; i < narg1; i++)  /* move down function and arguments */
        setobjs2s(L, ci->func.p + i, func + i);
      func = ci->func.p;  /* moved-down function */
      for (; narg1 <= nfixparams; narg1++)
        setnilvalue(s2v(func + narg1));  /* complete missing arguments */
      ci->top.p = func + 1 + fsize;  /* top for new function */
      lua_assert(ci->top.p <= L->stack_last.p);
      ci->u.l.savedpc = p->code;  /* starting point */
      ci->callstatus |= CIST_TAIL;
      L->top.p = func + narg1;  /* set top */
      return -1;
    }
    default: {  /* not a function */
      checkstackp(L, 1, func);  /* space for metamethod */
      status = tryfuncTM(L, func, status);  /* try '__call' metamethod */
      narg1++;
      goto retry;  /* try again */
    }
  }
}